

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snappy.cc
# Opt level: O2

bool __thiscall
duckdb_snappy::SnappyDecompressor::ReadUncompressedLength(SnappyDecompressor *this,uint32_t *result)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  size_t in_RAX;
  undefined4 extraout_var;
  ulong uVar4;
  size_t n;
  
  *result = 0;
  uVar4 = 0;
  n = in_RAX;
  while( true ) {
    if (0x1f < uVar4) {
      return false;
    }
    iVar2 = (*this->reader_->_vptr_Source[3])(this->reader_,&n);
    if (n == 0) {
      return false;
    }
    bVar1 = *(byte *)CONCAT44(extraout_var,iVar2);
    (*this->reader_->_vptr_Source[4])(this->reader_,1);
    uVar3 = bVar1 & 0x7f;
    if (((&LeftShiftOverflows(unsigned_char,unsigned_int)::masks)[uVar4] & (byte)uVar3) != 0) {
      return false;
    }
    *result = *result | uVar3 << ((byte)uVar4 & 0x1f);
    if (-1 < (char)bVar1) break;
    uVar4 = uVar4 + 7;
  }
  return true;
}

Assistant:

bool ReadUncompressedLength(uint32_t* result) {
    assert(ip_ == NULL);  // Must not have read anything yet
    // Length is encoded in 1..5 bytes
    *result = 0;
    uint32_t shift = 0;
    while (true) {
      if (shift >= 32) return false;
      size_t n;
      const char* ip = reader_->Peek(&n);
      if (n == 0) return false;
      const unsigned char c = *(reinterpret_cast<const unsigned char*>(ip));
      reader_->Skip(1);
      uint32_t val = c & 0x7f;
      if (LeftShiftOverflows(static_cast<uint8_t>(val), shift)) return false;
      *result |= val << shift;
      if (c < 128) {
        break;
      }
      shift += 7;
    }
    return true;
  }